

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O0

void * __thiscall
LdConfigEntryWrapper::getFieldPtr(LdConfigEntryWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t counter;
  void *ptr;
  size_t subField_local;
  size_t fieldId_local;
  LdConfigEntryWrapper *this_local;
  
  iVar1 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  this_local = (LdConfigEntryWrapper *)CONCAT44(extraout_var,iVar1);
  if (this_local == (LdConfigEntryWrapper *)0x0) {
    this_local = (LdConfigEntryWrapper *)0x0;
  }
  else if (fieldId != 0xffffffffffffffff) {
    iVar1 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0xf])();
    if (fieldId < CONCAT44(extraout_var_00,iVar1)) {
      if (fieldId != 0) {
        this_local = (LdConfigEntryWrapper *)
                     ((long)&(this_local->super_ExeNodeWrapper).super_ExeElementWrapper.
                             super_AbstractByteBuffer._vptr_AbstractByteBuffer + 4);
      }
    }
    else {
      this_local = (LdConfigEntryWrapper *)0x0;
    }
  }
  return this_local;
}

Assistant:

void* LdConfigEntryWrapper::getFieldPtr(size_t fieldId, size_t subField)
{
    void* ptr = getPtr();
    if (!ptr) return NULL;

    if (fieldId == NONE) {
        return ptr;
    }
    size_t counter = getFieldsCount();
    if (fieldId >= counter) return NULL;
    if (fieldId == HANDLER_ADDR) {
        return ptr;
    }
    return (void*)((ULONGLONG)ptr + sizeof(DWORD));
}